

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O1

FeatureVectorizer * __thiscall
CoreML::Specification::FeatureVectorizer::New(FeatureVectorizer *this,Arena *arena)

{
  FeatureVectorizer *this_00;
  
  this_00 = (FeatureVectorizer *)operator_new(0x30);
  FeatureVectorizer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FeatureVectorizer>(arena,this_00);
  }
  return this_00;
}

Assistant:

FeatureVectorizer* FeatureVectorizer::New(::google::protobuf::Arena* arena) const {
  FeatureVectorizer* n = new FeatureVectorizer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}